

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  undefined8 uVar1;
  short bs;
  short bs_1;
  value_type_conflict1 *__val;
  long lVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  int n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  channelData;
  uchar bitmap [8192];
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_1;
  int hlink [65537];
  long *aplStack_e0058 [2];
  long alStack_e0048 [65536];
  allocator<char> aaStack_60048 [393240];
  
  if ((memory_out != (uchar **)0x0 && exrImage != (EXRImage *)0x0) &&
     ((uint)exrImage->compression < 5)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&stack0xffffffffffe1dd98,0,
               &stack0xffffffffffe1ff88);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&stack0xffffffffffe1dd98,0,
               &stack0xffffffffffe1ff88);
    if (0 < exrImage->num_channels) {
      lVar2 = 0;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)aplStack_e0058,exrImage->channel_names[lVar2],aaStack_60048);
        std::__cxx11::string::operator=((string *)&stack0xffffffffffe1ff88,(string *)aplStack_e0058)
        ;
        if (aplStack_e0058[0] != alStack_e0048) {
          operator_delete(aplStack_e0058[0],alStack_e0048[0] + 1);
        }
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::push_back((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     *)&stack0xffffffffffe1de98,(value_type *)&stack0xffffffffffe1ff88);
        lVar2 = lVar2 + 1;
      } while (lVar2 < exrImage->num_channels);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffe9ff98,1);
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    uVar1 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *)&stack0xffffffffffe1de98);
    _Unwind_Resume(uVar1);
  }
  if (err != (char **)0x0) {
    *err = "Invalid argument.";
  }
  return 0;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL || exrImage->compression < 0 ||
      exrImage->compression > TINYEXR_COMPRESSIONTYPE_PIZ) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return 0;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlines = 1;
  if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP) {
    numScanlines = 16;
  } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
    numScanlines = 32;
  }

  // Write attributes.
  std::vector<ChannelInfo> channels;
  {
    std::vector<unsigned char> data;

    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int comp = exrImage->compression;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&comp));
    }
    WriteAttributeToMemory(memory, "compression", "compression",
                           reinterpret_cast<const unsigned char *>(&comp), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name,
                             exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(
                                 &exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlines;
  if (numBlocks * numScanlines < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlines * i;
    int endY = (std::min)(numScanlines * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_NONE) {

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = (unsigned int)buf.size();
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), buf.begin(), buf.begin() + dataLen);

    } else if ((exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
               (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP)) {

      std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
      unsigned long long outSize = block.size();

      CompressZip(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size());

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize; // truncate
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
      unsigned int bufLen =
          1024 +
          1.2 * (unsigned int)buf.size(); // @fixme { compute good bound. }
      std::vector<unsigned char> block(bufLen);
      unsigned int outSize = static_cast<unsigned int>(block.size());

      CompressPiz(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size(), channels, exrImage->width, h);

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize;
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else {
      assert(0);
    }

  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}